

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  ulong uVar1;
  bool bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  RK_S32 RVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  uVar1 = frm->val;
  uVar3 = uVar1 >> 0x30;
  if (((uint)uVar1 & 0x41) == 1) {
    if ((char)uVar1 < '\0') {
      bVar2 = false;
      uVar4 = 0;
      do {
        bVar8 = true;
        uVar5 = uVar4;
        if (((cpb->cpb_refs[(long)(int)uVar4 + 0x10].val & 1) != 0) &&
           ((((uint)cpb->cpb_refs[(long)(int)uVar4 + 0x10].val ^ *(uint *)frm) & 0xf00) == 0)) {
          uVar5 = uVar4 + 0x10;
          bVar2 = true;
          if (((byte)enc_refs_debug & 2) == 0) {
            bVar8 = false;
          }
          else {
            bVar8 = false;
            _mpp_log_l(4,"mpp_enc_refs","found ltr ref %d at pos %d\n","check_ref_cpb_pos",uVar3,
                       (ulong)uVar5);
            bVar2 = true;
          }
        }
        if (!bVar8) {
          uVar7 = (ulong)uVar5;
          break;
        }
        uVar4 = uVar5 + 1;
        uVar7 = (ulong)uVar4;
      } while ((int)uVar5 < 0xf);
    }
    else {
      uVar7 = 0;
      bVar2 = false;
      do {
        if (((byte)enc_refs_debug & 2) != 0) {
          in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),
                            (uint)*(ushort *)((long)cpb->cpb_refs + uVar7 * 8 + 6));
          _mpp_log_l(4,"mpp_enc_refs","matching ref %d at pos %d %d\n","check_ref_cpb_pos",uVar3,
                     uVar7 & 0xffffffff,in_RAX);
        }
        bVar8 = (cpb->cpb_refs[uVar7].val & 1) != 0;
        bVar9 = (short)(cpb->cpb_refs[uVar7].val >> 0x30) == (short)(uVar1 >> 0x30);
        if ((bVar9 && bVar8) && (bVar2 = true, ((byte)enc_refs_debug & 2) != 0)) {
          _mpp_log_l(4,"mpp_enc_refs","found ref %d at pos %d\n","check_ref_cpb_pos",uVar3,
                     uVar7 & 0xffffffff);
        }
        if (bVar9 && bVar8) goto LAB_00124273;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x10);
      uVar7 = 0x10;
    }
LAB_00124273:
    RVar6 = (RK_S32)uVar7;
    if (!bVar2) {
      _mpp_log_l(2,"mpp_enc_refs","frm %d can NOT be found in st refs!!\n","check_ref_cpb_pos",uVar3
                );
      _dump_cpb(cpb,"check_ref_cpb_pos",0x1be);
      RVar6 = -1;
    }
  }
  else {
    RVar6 = -1;
    if (((byte)enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm %d is not valid ref frm\n","check_ref_cpb_pos",uVar3);
    }
  }
  return RVar6;
}

Assistant:

static RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 found = 0;
    RK_S32 pos = -1;

    if (!frm->valid || frm->is_non_ref) {
        enc_refs_dbg_flow("frm %d is not valid ref frm\n", seq_idx);
        return pos;
    }

    if (frm->is_lt_ref) {
        /* find same lt_idx */
        for (pos = 0; pos < MAX_CPB_LT_FRM; pos++) {
            RK_S32 cpb_idx = pos + MAX_CPB_ST_FRM;
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[cpb_idx];

            if (cpb_ref->valid && cpb_ref->lt_idx == frm->lt_idx) {
                pos = cpb_idx;
                enc_refs_dbg_flow("found ltr ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    } else {
        /* search seq_idx in cpb to check the st cpb size */
        for (pos = 0; pos < MAX_CPB_ST_FRM; pos++) {
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[pos];

            enc_refs_dbg_flow("matching ref %d at pos %d %d\n",
                              seq_idx, pos, cpb_ref->seq_idx);

            if (cpb_ref->valid && cpb_ref->seq_idx == seq_idx) {
                enc_refs_dbg_flow("found ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    }

    if (!found) {
        mpp_err_f("frm %d can NOT be found in st refs!!\n", seq_idx);
        pos = -1;
        dump_cpb(cpb);
    }

    return pos;
}